

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlibraryinfo.cpp
# Opt level: O0

bool pathIsAbsolute(QString *path)

{
  bool bVar1;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  char in_stack_ffffffffffffff6e;
  undefined4 in_stack_ffffffffffffff70;
  CaseSensitivity in_stack_ffffffffffffff74;
  undefined7 in_stack_ffffffffffffff78;
  QLatin1Char in_stack_ffffffffffffff7f;
  QFileSystemEntry *this;
  QChar in_stack_ffffffffffffff8e;
  bool local_65;
  QFileSystemEntry local_40;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  Qt::Literals::StringLiterals::operator____L1(in_stack_ffffffffffffff6e);
  QChar::QChar<QLatin1Char,_true>
            ((QChar *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             in_stack_ffffffffffffff7f);
  bVar1 = QString::startsWith((QString *)
                              CONCAT17(in_stack_ffffffffffffff7f.ch,in_stack_ffffffffffffff78),
                              in_stack_ffffffffffffff8e,in_stack_ffffffffffffff74);
  local_65 = true;
  if (!bVar1) {
    this = &local_40;
    QFileSystemEntry::QFileSystemEntry(this,in_RDI);
    local_65 = QFileSystemEntry::isAbsolute(this);
    QFileSystemEntry::~QFileSystemEntry
              ((QFileSystemEntry *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_65;
  }
  __stack_chk_fail();
}

Assistant:

static bool pathIsAbsolute(const QString &path)
{
    using FromInternalPath = QFileSystemEntry::FromInternalPath;
    return path.startsWith(':'_L1) || QFileSystemEntry(path, FromInternalPath{}).isAbsolute();
}